

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O1

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = (byte *)in->data_;
  sVar7 = in->size_;
  if (sVar7 == 0) {
    uVar6 = 0;
    pbVar5 = pbVar3;
  }
  else {
    pbVar5 = pbVar3 + sVar7;
    uVar6 = 0;
    pbVar4 = pbVar3;
    do {
      bVar1 = *pbVar4;
      iVar8 = 2;
      if (0xf5 < (byte)(bVar1 - 0x3a)) {
        iVar8 = 1;
        if ((uVar6 < 0x199999999999999a) && (uVar6 != 0x1999999999999999 || bVar1 < 0x36)) {
          uVar6 = (ulong)(bVar1 & 0xf) + uVar6 * 10;
          iVar8 = 0;
        }
      }
      if (iVar8 != 0) {
        pbVar5 = pbVar4;
        if (iVar8 != 2) {
          bVar9 = false;
          goto LAB_00d4efe1;
        }
        break;
      }
      pbVar4 = pbVar4 + 1;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  *val = uVar6;
  uVar6 = (long)pbVar5 - (long)pbVar3;
  if (in->size_ < uVar6) {
    __assert_fail("n <= size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                  ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
  }
  in->data_ = (char *)(pbVar3 + uVar6);
  in->size_ = in->size_ - uVar6;
  bVar9 = pbVar5 != pbVar3;
LAB_00d4efe1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

size_t size() const { return size_; }